

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O3

char * mem_type(uint8_t version,uint16_t start)

{
  undefined3 in_register_00000039;
  
  if (CONCAT31(in_register_00000039,version) == 0x10) {
    return &DAT_0026e384 + *(int *)(&DAT_0026e384 + (ulong)(bios->data[start] & 0xf) * 4);
  }
  return "unknown table version (0x%x)\n";
}

Assistant:

const char * mem_type(uint8_t version, uint16_t start)
{
	uint8_t ram_type = bios->data[start] & 0x0f;

	if (version != 0x10)
		return "unknown table version (0x%x)\n";

	switch (ram_type) {
	case 0:
		return "DDR2";
		break;
	case 1:
		return "DDR3";
		break;
	case 2:
		return "GDDR3";
		break;
	case 3:
		return "GDDR5";
		break;
	case 6:
		return "HBM2";
		break;
	case 8:
		return "GDDR5X";
		break;
	case 9:
		return "GDDR6";
		break;
	case 15:
		return "Skip";
		break;
	default:
		return "Unknown ram type";
	}
}